

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O3

void Ptex::v2_4::PtexUtils::anon_unknown_1::average<Ptex::v2_4::PtexHalf>
               (PtexHalf *src,int sstride,int uw,int vw,PtexHalf *dst,int nchan)

{
  PtexHalf *pPVar1;
  long lVar2;
  long lVar3;
  uint16_t uVar4;
  int iVar5;
  long lVar6;
  PtexHalf *pPVar7;
  ulong uVar8;
  void *__s;
  float val;
  undefined8 uStack_40;
  float local_38 [2];
  
  lVar2 = -((long)nchan * 4 + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)local_38 + lVar2);
  local_38[0] = (float)uw;
  local_38[1] = (float)vw;
  *(undefined8 *)((long)&uStack_40 + lVar2) = 0x10e7c2;
  memset(__s,0,(long)nchan << 2);
  iVar5 = (sstride / 2) * (int)local_38[1];
  if (iVar5 != 0) {
    pPVar1 = src + iVar5;
    iVar5 = nchan * (int)local_38[0];
    do {
      pPVar7 = src;
      if (iVar5 != 0) {
        pPVar7 = src + iVar5;
        do {
          if (0 < nchan) {
            lVar3 = 0;
            do {
              lVar6 = lVar3;
              *(float *)((long)__s + lVar6 * 2) =
                   *(float *)(PtexHalf::h2fTable + (ulong)*(ushort *)((long)&src->bits + lVar6) * 4)
                   + *(float *)((long)__s + lVar6 * 2);
              lVar3 = lVar6 + 2;
            } while ((ulong)(uint)nchan * 2 != lVar6 + 2);
            src = (PtexHalf *)((long)&src[1].bits + lVar6);
          }
        } while (src != pPVar7);
      }
      src = pPVar7 + (sstride / 2 - iVar5);
    } while (src != pPVar1);
  }
  if (0 < nchan) {
    local_38[1] = 1.0 / (float)((int)local_38[1] * (int)local_38[0]);
    uVar8 = 0;
    do {
      val = *(float *)((long)__s + uVar8 * 4) * local_38[1];
      *(undefined8 *)((long)&uStack_40 + lVar2) = 0x10e875;
      uVar4 = PtexHalf::fromFloat(val);
      dst[uVar8].bits = uVar4;
      uVar8 = uVar8 + 1;
    } while ((uint)nchan != uVar8);
  }
  return;
}

Assistant:

inline void average(const T* src, int sstride, int uw, int vw,
                        T* dst, int nchan)
    {
        float* buff = (float*) alloca(nchan*sizeof(float));
        memset(buff, 0, nchan*sizeof(float));
        sstride /= (int)sizeof(T);
        int rowlen = uw*nchan;
        int rowskip = sstride - rowlen;
        for (const T* end = src + vw*sstride; src != end; src += rowskip)
            for (const T* rowend = src + rowlen; src != rowend;)
                for (int i = 0; i < nchan; i++) buff[i] += (float)*src++;
        float scale = 1.0f/(float)(uw*vw);
        for (int i = 0; i < nchan; i++) dst[i] = T(buff[i]*scale);
    }